

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDateTime>::emplace<QDateTime>
          (QMovableArrayOps<QDateTime> *this,qsizetype i,QDateTime *args)

{
  QDateTime **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_58;
  QDateTime tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size == i) {
      qVar5 = QArrayDataPointer<QDateTime>::freeSpaceAtEnd((QArrayDataPointer<QDateTime> *)this);
      if (qVar5 == 0) goto LAB_001883bc;
      QDateTime::QDateTime
                ((this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr +
                 (this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size *
                 8,args);
LAB_001884a4:
      pqVar2 = &(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00188463;
    }
LAB_001883bc:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QDateTime>::freeSpaceAtBegin((QArrayDataPointer<QDateTime> *)this);
      if (qVar5 != 0) {
        QDateTime::QDateTime
                  ((this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr
                   + -8,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr;
        *ppQVar1 = *ppQVar1 + -8;
        goto LAB_001884a4;
      }
    }
  }
  _tmp = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::QDateTime(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size != 0;
  QArrayDataPointer<QDateTime>::detachAndGrow
            ((QArrayDataPointer<QDateTime> *)this,(uint)(i == 0 && bVar6),1,(QDateTime **)0x0,
             (QArrayDataPointer<QDateTime> *)0x0);
  if (i == 0 && bVar6) {
    QDateTime::QDateTime
              ((this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr + -8
               ,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr;
    *ppQVar1 = *ppQVar1 + -8;
    pqVar2 = &(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_58,(QArrayDataPointer<QDateTime> *)this,i,1);
    QDateTime::QDateTime(local_58.displaceFrom,&tmp);
    local_58.displaceFrom = local_58.displaceFrom + 8;
    (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
  }
  QDateTime::~QDateTime(&tmp);
LAB_00188463:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }